

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

shared_ptr<tonk::gateway::MappedPortLifetime>
tonk::gateway::RequestPortMap(uint16_t localPort,char *interfaceAddress)

{
  ulong uVar1;
  undefined1 *puVar2;
  AppRequest *pAVar3;
  int iVar4;
  char *pcVar5;
  OutputWorker *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_0000003a;
  element_type *peVar6;
  shared_ptr<tonk::gateway::MappedPortLifetime> sVar7;
  Result result;
  undefined1 local_1c8 [8];
  string local_1c0;
  undefined1 local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  peVar6 = (element_type *)CONCAT62(in_register_0000003a,localPort);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)APILock);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  if (API_References < 1) {
    Delete_PortMapper();
    pcVar5 = (char *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (pcVar5 == (char *)0x0) {
      m_PortMapper = (char *)0x0;
      (peVar6->Request).LocalPort = 0;
      *(undefined2 *)&(peVar6->Request).field_0x2 = 0;
      (peVar6->Request).Type = Add;
      (peVar6->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
      goto LAB_001574de;
    }
    pcVar5[0x10] = '\0';
    pcVar5[0x11] = '\0';
    pcVar5[0x12] = '\0';
    pcVar5[0x13] = '\0';
    pcVar5[0x14] = '\0';
    pcVar5[0x15] = '\0';
    pcVar5[0x16] = '\0';
    pcVar5[0x17] = '\0';
    m_PortMapper = pcVar5;
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
    pcVar5[2] = '\0';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    pcVar5[8] = '\0';
    pcVar5[9] = '\0';
    pcVar5[10] = '\0';
    pcVar5[0xb] = '\0';
    pcVar5[0xc] = '\0';
    pcVar5[0xd] = '\0';
    pcVar5[0xe] = '\0';
    pcVar5[0xf] = '\0';
    GatewayPortMapper::Initialize((GatewayPortMapper *)local_1c8,pcVar5);
    if (local_1c8 != (undefined1  [8])0x0) {
      Result::ToJson_abi_cxx11_((string *)(local_1c8 + 8),(Result *)local_1c8);
      if (DAT_001e1cd0 < 5) {
        local_1a0._0_8_ = ModuleLogger;
        local_1a0._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,DAT_001e1d00,DAT_001e1d08);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"Unable to initialize port mapper: ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,
                   (char *)CONCAT44(local_1c0._M_dataplus._M_p._4_4_,
                                    CONCAT22(local_1c0._M_dataplus._M_p._2_2_,
                                             local_1c0._M_dataplus._M_p._0_2_)),
                   local_1c0._M_string_length);
        this = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this,(LogStringBuffer *)local_1a0);
        std::__cxx11::ostringstream::~ostringstream(local_190);
        std::ios_base::~ios_base(local_120);
      }
      puVar2 = (undefined1 *)
               CONCAT44(local_1c0._M_dataplus._M_p._4_4_,
                        CONCAT22(local_1c0._M_dataplus._M_p._2_2_,local_1c0._M_dataplus._M_p._0_2_))
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 != &local_1c0.field_2) {
        operator_delete(puVar2);
      }
      Delete_PortMapper();
      (peVar6->Request).LocalPort = 0;
      *(undefined2 *)&(peVar6->Request).field_0x2 = 0;
      (peVar6->Request).Type = Add;
      (peVar6->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
      Result::~Result((Result *)local_1c8);
      goto LAB_001574de;
    }
    Result::~Result((Result *)local_1c8);
  }
  local_1a0._0_8_ = operator_new(0x18,(nothrow_t *)&std::nothrow);
  if ((SSDPRequester *)local_1a0._0_8_ != (SSDPRequester *)0x0) {
    (((SSDPRequester *)local_1a0._0_8_)->LAN).Gateway.type_ = ipv4;
    (((SSDPRequester *)local_1a0._0_8_)->LAN).Gateway.ipv4_address_ = (in4_addr_type)0x0;
    *(uint16_t *)&((SSDPRequester *)local_1a0._0_8_)->State = 0;
    *(undefined2 *)((long)&((SSDPRequester *)local_1a0._0_8_)->State + 2) = 0;
    *(RequestType *)((long)&((SSDPRequester *)local_1a0._0_8_)->State + 4) = Add;
    ((SSDPRequester *)local_1a0._0_8_)->Host = (AsioHost *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tonk::gateway::MappedPortLifetime*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a0 + 8),
             (MappedPortLifetime *)local_1a0._0_8_);
  pcVar5 = m_PortMapper;
  if ((StateMachine *)local_1a0._0_8_ == (StateMachine *)0x0) {
    (peVar6->Request).LocalPort = 0;
    *(undefined2 *)&(peVar6->Request).field_0x2 = 0;
    (peVar6->Request).Type = Add;
    (peVar6->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_1a0._12_4_,local_1a0._8_4_)
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_1a0._12_4_,local_1a0._8_4_));
    }
  }
  else {
    if (m_PortMapper != (char *)0x0) {
      local_1c0._M_dataplus._M_p._4_4_ = 0;
      local_1c0._M_string_length = local_1a0._0_8_;
      uVar1 = (ulong)CONCAT22(local_1c0._M_dataplus._M_p._2_2_,(short)interfaceAddress);
      pAVar3 = (AppRequest *)local_1a0._0_8_;
      pAVar3->LocalPort = (short)uVar1;
      *(short *)&pAVar3->field_0x2 = (short)(uVar1 >> 0x10);
      pAVar3->Type = (int)(uVar1 >> 0x20);
      *(undefined8 *)(local_1a0._0_8_ + 8) = local_1a0._0_8_;
      local_1c0._M_dataplus._M_p._0_2_ = (short)interfaceAddress;
      StateMachine::API_Request(*(StateMachine **)(pcVar5 + 0x10),(AppRequest *)(local_1c8 + 8));
    }
    API_References = API_References + 1;
    (peVar6->Request).LocalPort = local_1a0._0_2_;
    *(undefined2 *)&(peVar6->Request).field_0x2 = local_1a0._2_2_;
    (peVar6->Request).Type = local_1a0._4_4_;
    (peVar6->Request).API_LifetimePtr =
         (MappedPortLifetime *)CONCAT44(local_1a0._12_4_,local_1a0._8_4_);
  }
LAB_001574de:
  pthread_mutex_unlock((pthread_mutex_t *)APILock);
  sVar7.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar7.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar6;
  return (shared_ptr<tonk::gateway::MappedPortLifetime>)
         sVar7.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MappedPortLifetime> RequestPortMap(
    uint16_t localPort,
    const char* interfaceAddress)
{
    std::lock_guard<std::mutex> locker(APILock);

    // If initialization is needed:
    TONK_DEBUG_ASSERT(API_References >= 0);
    if (API_References <= 0)
    {
        TONK_DEBUG_ASSERT(m_PortMapper == nullptr);
        Delete_PortMapper();

        // Allocate port mapper
        m_PortMapper = new(std::nothrow) GatewayPortMapper;
        if (!m_PortMapper) {
            return nullptr; // OOM
        }

        // Initialize background thread and Asio objects
        Result result = m_PortMapper->Initialize(interfaceAddress);
        if (result.IsFail())
        {
            ModuleLogger.Error("Unable to initialize port mapper: ", result.ToJson());
            Delete_PortMapper();
            return nullptr;
        }
    }

    // Create a request lifetime object
    std::shared_ptr<MappedPortLifetime> ref = MakeSharedNoThrow<MappedPortLifetime>();
    if (!ref) {
        return nullptr; // OOM
    }

    // Put in request
    TONK_DEBUG_ASSERT(m_PortMapper);
    if (m_PortMapper)
    {
        AppRequest request;
        request.LocalPort = localPort;
        request.Type = RequestType::Add;
        request.API_LifetimePtr = ref.get();

        ref->Request = request;

        // Insert request
        m_PortMapper->State->API_Request(request);
    }

    // Increment references to API
    ++API_References;

    return ref;
}